

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int RGB24ToARGB(uint8_t *src_rgb24,int src_stride_rgb24,uint8_t *dst_argb,int dst_stride_argb,
               int width,int height)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  
  iVar3 = -1;
  if ((height != 0 && 0 < width) && (dst_argb != (uint8_t *)0x0 && src_rgb24 != (uint8_t *)0x0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_rgb24 = src_rgb24 + ~height * src_stride_rgb24;
      src_stride_rgb24 = -src_stride_rgb24;
    }
    if (width * 4 == dst_stride_argb && width * 3 == src_stride_rgb24) {
      width = iVar1 * width;
      src_stride_rgb24 = 0;
      dst_stride_argb = 0;
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = RGB24ToARGBRow_SSSE3;
    }
    else {
      pcVar4 = RGB24ToARGBRow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar4 = RGB24ToARGBRow_C;
    }
    iVar3 = 0;
    if (0 < iVar1) {
      do {
        (*pcVar4)(src_rgb24,dst_argb,width);
        src_rgb24 = src_rgb24 + src_stride_rgb24;
        dst_argb = dst_argb + dst_stride_argb;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

LIBYUV_API
int RGB24ToARGB(const uint8_t* src_rgb24,
                int src_stride_rgb24,
                uint8_t* dst_argb,
                int dst_stride_argb,
                int width,
                int height) {
  int y;
  void (*RGB24ToARGBRow)(const uint8_t* src_rgb, uint8_t* dst_argb, int width) =
      RGB24ToARGBRow_C;
  if (!src_rgb24 || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_rgb24 = src_rgb24 + (height - 1) * src_stride_rgb24;
    src_stride_rgb24 = -src_stride_rgb24;
  }
  // Coalesce rows.
  if (src_stride_rgb24 == width * 3 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_rgb24 = dst_stride_argb = 0;
  }
#if defined(HAS_RGB24TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    RGB24ToARGBRow = RGB24ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      RGB24ToARGBRow = RGB24ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_RGB24TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    RGB24ToARGBRow = RGB24ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      RGB24ToARGBRow = RGB24ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_RGB24TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    RGB24ToARGBRow = RGB24ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      RGB24ToARGBRow = RGB24ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_RGB24TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    RGB24ToARGBRow = RGB24ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      RGB24ToARGBRow = RGB24ToARGBRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    RGB24ToARGBRow(src_rgb24, dst_argb, width);
    src_rgb24 += src_stride_rgb24;
    dst_argb += dst_stride_argb;
  }
  return 0;
}